

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_compare_uints(void)

{
  int iVar1;
  int local_94;
  int local_90;
  int j;
  int i;
  int count;
  uint64_t nums [15];
  
  _plan(0x8a1,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_compare_uints");
  memcpy(&i,&DAT_00142410,0x78);
  for (local_90 = 0; local_90 < 0xf; local_90 = local_90 + 1) {
    for (local_94 = 0; local_94 < 0xf; local_94 = local_94 + 1) {
      test_compare_uint(*(uint64_t *)(&i + (long)local_90 * 2),
                        *(uint64_t *)(&i + (long)local_94 * 2));
    }
  }
  _space(_stdout);
  printf("# *** %s: done ***\n","test_compare_uints");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_compare_uints(void)
{
	plan(2209);
	header();

	uint64_t nums[] = {
		0, 1, 0x7eU, 0x7fU, 0x80U, 0xfeU, 0xffU, 0xfffeU, 0xffffU,
		0x10000U, 0xfffffffeU, 0xffffffffU, 0x100000000ULL,
		0xfffffffffffffffeULL, 0xffffffffffffffffULL
	};
	int count = sizeof(nums) / sizeof(*nums);
	for (int i = 0; i < count; i++) {
		for (int j = 0; j < count; j++) {
			test_compare_uint(nums[i], nums[j]);
		}
	}

	footer();
	return check_plan();
}